

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4ec2e9::BNTest_NegativeZero_Test::TestBody(BNTest_NegativeZero_Test *this)

{
  int iVar1;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  pointer message;
  char *in_R9;
  internal iVar3;
  UniquePtr<char> hex;
  UniquePtr<char> dec;
  UniquePtr<BIGNUM> denominator;
  UniquePtr<BIGNUM> numerator;
  UniquePtr<BIGNUM> a;
  UniquePtr<BIGNUM> b;
  UniquePtr<BIGNUM> c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  _Head_base<0UL,_char_*,_false> local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  AssertHelper local_40;
  _Head_base<0UL,_bignum_st_*,_false> local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  _Head_base<0UL,_bignum_st_*,_false> local_28;
  _Head_base<0UL,_bignum_st_*,_false> local_20;
  _Head_base<0UL,_bignum_st_*,_false> local_18;
  
  local_28._M_head_impl = (bignum_st *)BN_new();
  local_20._M_head_impl = (bignum_st *)BN_new();
  local_18._M_head_impl = (bignum_st *)BN_new();
  local_88._M_head_impl._0_1_ = (internal)((BIGNUM *)local_28._M_head_impl != (BIGNUM *)0x0);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_28._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_88,
               (AssertionResult *)(anon_var_dwarf_1aa588 + 0xc),"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x5c0,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_30);
  }
  else {
    local_88._M_head_impl._0_1_ = (internal)((BIGNUM *)local_20._M_head_impl != (BIGNUM *)0x0);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIGNUM *)local_20._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_30);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_88,(AssertionResult *)0x54bf23,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5c1,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_30);
    }
    else {
      local_88._M_head_impl._0_1_ = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
      local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
        testing::Message::Message((Message *)&local_30);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_60,(internal *)&local_88,(AssertionResult *)0x516d3e,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5c2,(char *)CONCAT71(local_60._1_7_,local_60[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_30);
      }
      else {
        iVar1 = BN_set_word((BIGNUM *)local_28._M_head_impl,1);
        local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_30);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_60,(internal *)&local_88,
                     (AssertionResult *)"BN_set_word(a.get(), 1)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x5c5,(char *)CONCAT71(local_60._1_7_,local_60[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_30)
          ;
        }
        else {
          BN_set_negative((BIGNUM *)local_28._M_head_impl,1);
          BN_zero(local_20._M_head_impl);
          iVar1 = BN_mul((BIGNUM *)local_18._M_head_impl,(BIGNUM *)local_28._M_head_impl,
                         (BIGNUM *)local_20._M_head_impl,
                         (BN_CTX *)
                         (this->super_BNTest).ctx_._M_t.
                         super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
          local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 != 0) {
            iVar1 = BN_is_zero(local_18._M_head_impl);
            iVar3 = (internal)(iVar1 != 0);
            local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_88._M_head_impl._0_1_ = iVar3;
            if (!(bool)iVar3) {
              testing::Message::Message((Message *)&local_30);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_60,(internal *)&local_88,
                         (AssertionResult *)"BN_is_zero(c.get())","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5c9,(char *)CONCAT71(local_60._1_7_,local_60[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_38,(Message *)&local_30);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_60._1_7_,local_60[0]),
                                local_50._M_allocated_capacity + 1);
              }
              if ((BIGNUM *)local_30._M_head_impl != (BIGNUM *)0x0) {
                (**(code **)(*(long *)local_30._M_head_impl + 8))();
              }
              if (local_80 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_80,local_80);
              }
            }
            iVar1 = BN_is_negative(local_18._M_head_impl);
            local_88._M_head_impl._0_1_ = (internal)(iVar1 == 0);
            local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_88._M_head_impl._0_1_) {
              testing::Message::Message((Message *)&local_30);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_60,(internal *)&local_88,
                         (AssertionResult *)"BN_is_negative(c.get())","true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5ca,(char *)CONCAT71(local_60._1_7_,local_60[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_38,(Message *)&local_30);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_60._1_7_,local_60[0]),
                                local_50._M_allocated_capacity + 1);
              }
              if ((BIGNUM *)local_30._M_head_impl != (BIGNUM *)0x0) {
                (**(code **)(*(long *)local_30._M_head_impl + 8))();
              }
              if (local_80 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_80,local_80);
              }
            }
            local_30._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)BN_new()
            ;
            local_38._M_head_impl = (bignum_st *)BN_new();
            local_88._M_head_impl._0_1_ =
                 (internal)((BIGNUM *)local_30._M_head_impl != (BIGNUM *)0x0);
            local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((BIGNUM *)local_30._M_head_impl == (BIGNUM *)0x0) {
              testing::Message::Message((Message *)&local_68);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_60,(internal *)&local_88,(AssertionResult *)"numerator",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5cd,(char *)CONCAT71(local_60._1_7_,local_60[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_70,(Message *)&local_68);
LAB_002b3caa:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_60._1_7_,local_60[0]),
                                local_50._M_allocated_capacity + 1);
              }
              if (local_68._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_68._M_head_impl + 8))();
              }
              if (local_80 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_80,local_80);
              }
            }
            else {
              local_88._M_head_impl._0_1_ =
                   (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,(AssertionResult *)"denominator"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5ce,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                goto LAB_002b3caa;
              }
              iVar1 = BN_set_word((BIGNUM *)local_30._M_head_impl,1);
              local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)"BN_set_word(numerator.get(), 1)","false","true",in_R9
                          );
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5d1,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                goto LAB_002b3caa;
              }
              iVar1 = BN_set_word((BIGNUM *)local_38._M_head_impl,2);
              local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)"BN_set_word(denominator.get(), 2)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5d2,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                goto LAB_002b3caa;
              }
              BN_set_negative((BIGNUM *)local_30._M_head_impl,1);
              iVar1 = BN_div((BIGNUM *)local_28._M_head_impl,(BIGNUM *)local_20._M_head_impl,
                             (BIGNUM *)local_30._M_head_impl,(BIGNUM *)local_38._M_head_impl,
                             (BN_CTX *)
                             (this->super_BNTest).ctx_._M_t.
                             super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
              local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)
                           "BN_div(a.get(), b.get(), numerator.get(), denominator.get(), ctx())",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5d5,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                goto LAB_002b3caa;
              }
              iVar1 = BN_is_zero(local_28._M_head_impl);
              iVar3 = (internal)(iVar1 != 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_88._M_head_impl._0_1_ = iVar3;
              if (!(bool)iVar3) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)"BN_is_zero(a.get())","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5d6,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_60._1_7_,local_60[0]),
                                  local_50._M_allocated_capacity + 1);
                }
                if (local_68._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                }
                if (local_80 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_80,local_80);
                }
              }
              iVar1 = BN_is_negative(local_28._M_head_impl);
              local_88._M_head_impl._0_1_ = (internal)(iVar1 == 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_88._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)"BN_is_negative(a.get())","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5d7,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_60._1_7_,local_60[0]),
                                  local_50._M_allocated_capacity + 1);
                }
                if (local_68._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                }
                if (local_80 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_80,local_80);
                }
              }
              iVar1 = BN_set_word((BIGNUM *)local_38._M_head_impl,1);
              local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)"BN_set_word(denominator.get(), 1)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5da,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                goto LAB_002b3caa;
              }
              iVar1 = BN_div((BIGNUM *)local_28._M_head_impl,(BIGNUM *)local_20._M_head_impl,
                             (BIGNUM *)local_30._M_head_impl,(BIGNUM *)local_38._M_head_impl,
                             (BN_CTX *)
                             (this->super_BNTest).ctx_._M_t.
                             super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
              local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)
                           "BN_div(a.get(), b.get(), numerator.get(), denominator.get(), ctx())",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5dc,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                goto LAB_002b3caa;
              }
              iVar1 = BN_is_zero(local_20._M_head_impl);
              iVar3 = (internal)(iVar1 != 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_88._M_head_impl._0_1_ = iVar3;
              if (!(bool)iVar3) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)"BN_is_zero(b.get())","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5dd,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_60._1_7_,local_60[0]),
                                  local_50._M_allocated_capacity + 1);
                }
                if (local_68._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                }
                if (local_80 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_80,local_80);
                }
              }
              iVar1 = BN_is_negative(local_20._M_head_impl);
              local_88._M_head_impl._0_1_ = (internal)(iVar1 == 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_88._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)"BN_is_negative(b.get())","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5de,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_60._1_7_,local_60[0]),
                                  local_50._M_allocated_capacity + 1);
                }
                if (local_68._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                }
                if (local_80 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_80,local_80);
                }
              }
              BN_zero(local_28._M_head_impl);
              BN_set_negative((BIGNUM *)local_28._M_head_impl,1);
              iVar1 = BN_is_negative(local_28._M_head_impl);
              local_88._M_head_impl._0_1_ = (internal)(iVar1 == 0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_88._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,
                           (AssertionResult *)"BN_is_negative(a.get())","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5e3,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_60._1_7_,local_60[0]),
                                  local_50._M_allocated_capacity + 1);
                }
                if (local_68._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                }
                if (local_80 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_80,local_80);
                }
              }
              (local_28._M_head_impl)->neg = 1;
              local_68._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   BN_bn2dec((BIGNUM *)local_28._M_head_impl);
              local_70._M_head_impl = BN_bn2hex((BIGNUM *)local_28._M_head_impl);
              local_88._M_head_impl._0_1_ =
                   (internal)
                   (local_68._M_head_impl !=
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_68._M_head_impl ==
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                testing::Message::Message((Message *)&local_78);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_60,(internal *)&local_88,(AssertionResult *)"dec","false"
                           ,"true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_40,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5ea,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
LAB_002b4530:
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_80;
                testing::internal::AssertHelper::~AssertHelper(&local_40);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_60._1_7_,local_60[0]),
                                  local_50._M_allocated_capacity + 1);
                }
                if (local_78._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_78._M_head_impl + 8))();
                }
                local_58 = local_80;
                if (local_80 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_002b4572:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(this_00,local_58);
                }
              }
              else {
                local_88._M_head_impl._0_1_ = (internal)(local_70._M_head_impl != (char *)0x0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (local_70._M_head_impl == (char *)0x0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,(AssertionResult *)0x58b986,
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5eb,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  goto LAB_002b4530;
                }
                testing::internal::CmpHelperSTREQ
                          ((internal *)local_60,"\"-0\"","dec.get()","-0",
                           (char *)local_68._M_head_impl);
                if (local_60[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_88);
                  if (local_58 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = (local_58->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_78,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5ec,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_78,(Message *)&local_88);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
                  if (local_88._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_88._M_head_impl + 8))();
                  }
                }
                if (local_58 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_58,local_58);
                }
                testing::internal::CmpHelperSTREQ
                          ((internal *)local_60,"\"-0\"","hex.get()","-0",local_70._M_head_impl);
                if (local_60[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_88);
                  if (local_58 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = (local_58->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_78,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5ed,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_78,(Message *)&local_88);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
                  if (local_88._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_88._M_head_impl + 8))();
                  }
                }
                if (local_58 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_58,local_58);
                }
                iVar1 = BN_set_word((BIGNUM *)local_28._M_head_impl,1);
                local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_set_word(a.get(), 1)","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5f0,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  goto LAB_002b4530;
                }
                BN_set_negative((BIGNUM *)local_28._M_head_impl,1);
                iVar1 = BN_rshift((BIGNUM *)local_20._M_head_impl,(BIGNUM *)local_28._M_head_impl,1)
                ;
                local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_rshift(b.get(), a.get(), 1)","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5f3,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  goto LAB_002b4530;
                }
                iVar1 = BN_is_zero(local_20._M_head_impl);
                iVar3 = (internal)(iVar1 != 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_88._M_head_impl._0_1_ = iVar3;
                if (!(bool)iVar3) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_is_zero(b.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5f4,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_40);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_60._1_7_,local_60[0]),
                                    local_50._M_allocated_capacity + 1);
                  }
                  if (local_78._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_78._M_head_impl + 8))();
                  }
                  if (local_80 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_80,local_80);
                  }
                }
                iVar1 = BN_is_negative(local_20._M_head_impl);
                local_88._M_head_impl._0_1_ = (internal)(iVar1 == 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_88._M_head_impl._0_1_) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_is_negative(b.get())","true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5f5,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_40);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_60._1_7_,local_60[0]),
                                    local_50._M_allocated_capacity + 1);
                  }
                  if (local_78._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_78._M_head_impl + 8))();
                  }
                  if (local_80 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_80,local_80);
                  }
                }
                iVar1 = BN_rshift1((BIGNUM *)local_18._M_head_impl,(BIGNUM *)local_28._M_head_impl);
                local_88._M_head_impl._0_1_ = (internal)(iVar1 != 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_rshift1(c.get(), a.get())","false","true",in_R9)
                  ;
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5f7,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  goto LAB_002b4530;
                }
                iVar1 = BN_is_zero(local_18._M_head_impl);
                iVar3 = (internal)(iVar1 != 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_88._M_head_impl._0_1_ = iVar3;
                if (!(bool)iVar3) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_is_zero(c.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5f8,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_40);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_60._1_7_,local_60[0]),
                                    local_50._M_allocated_capacity + 1);
                  }
                  if (local_78._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_78._M_head_impl + 8))();
                  }
                  if (local_80 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_80,local_80);
                  }
                }
                iVar1 = BN_is_negative(local_18._M_head_impl);
                local_88._M_head_impl._0_1_ = (internal)(iVar1 == 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 != 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_is_negative(c.get())","true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5f9,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_40);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_60._1_7_,local_60[0]),
                                    local_50._M_allocated_capacity + 1);
                  }
                  if (local_78._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_78._M_head_impl + 8))();
                  }
                  if (local_80 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_80,local_80);
                  }
                }
                local_88._M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0xffffffffffffffff;
                local_78._M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     BN_div_word((BIGNUM *)local_28._M_head_impl,2);
                testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
                          ((internal *)local_60,"(BN_ULONG)-1","BN_div_word(a.get(), 2)",
                           (unsigned_long *)&local_88,(unsigned_long *)&local_78);
                if (local_60[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_88);
                  if (local_58 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    message = "";
                  }
                  else {
                    message = (local_58->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_78,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5fc,message);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_78,(Message *)&local_88);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
                  if (local_88._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_88._M_head_impl + 8))();
                  }
                  if (local_58 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  goto LAB_002b4577;
                  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_58;
                  goto LAB_002b4572;
                }
                if (local_58 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_58,local_58);
                }
                iVar1 = BN_is_zero(local_28._M_head_impl);
                iVar3 = (internal)(iVar1 != 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_88._M_head_impl._0_1_ = iVar3;
                if (!(bool)iVar3) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_is_zero(a.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5fd,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_40);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_60._1_7_,local_60[0]),
                                    local_50._M_allocated_capacity + 1);
                  }
                  if (local_78._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_78._M_head_impl + 8))();
                  }
                  if (local_80 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_80,local_80);
                  }
                }
                iVar1 = BN_is_negative(local_28._M_head_impl);
                local_88._M_head_impl._0_1_ = (internal)(iVar1 == 0);
                local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 != 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_60,(internal *)&local_88,
                             (AssertionResult *)"BN_is_negative(a.get())","true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5fe,(char *)CONCAT71(local_60._1_7_,local_60[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
                  goto LAB_002b4530;
                }
              }
LAB_002b4577:
              std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<char,_bssl::internal::Deleter> *)&local_70);
              std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<char,_bssl::internal::Deleter> *)&local_68);
            }
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_30);
            goto LAB_002b39c9;
          }
          testing::Message::Message((Message *)&local_30);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_60,(internal *)&local_88,
                     (AssertionResult *)"BN_mul(c.get(), a.get(), b.get(), ctx())","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x5c8,(char *)CONCAT71(local_60._1_7_,local_60[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_30)
          ;
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  if ((BIGNUM *)local_30._M_head_impl != (BIGNUM *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
LAB_002b39c9:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_18);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_20);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_28);
  return;
}

Assistant:

TEST_F(BNTest, NegativeZero) {
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> c(BN_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(b);
  ASSERT_TRUE(c);

  // Test that BN_mul never gives negative zero.
  ASSERT_TRUE(BN_set_word(a.get(), 1));
  BN_set_negative(a.get(), 1);
  BN_zero(b.get());
  ASSERT_TRUE(BN_mul(c.get(), a.get(), b.get(), ctx()));
  EXPECT_TRUE(BN_is_zero(c.get()));
  EXPECT_FALSE(BN_is_negative(c.get()));

  bssl::UniquePtr<BIGNUM> numerator(BN_new()), denominator(BN_new());
  ASSERT_TRUE(numerator);
  ASSERT_TRUE(denominator);

  // Test that BN_div never gives negative zero in the quotient.
  ASSERT_TRUE(BN_set_word(numerator.get(), 1));
  ASSERT_TRUE(BN_set_word(denominator.get(), 2));
  BN_set_negative(numerator.get(), 1);
  ASSERT_TRUE(
      BN_div(a.get(), b.get(), numerator.get(), denominator.get(), ctx()));
  EXPECT_TRUE(BN_is_zero(a.get()));
  EXPECT_FALSE(BN_is_negative(a.get()));

  // Test that BN_div never gives negative zero in the remainder.
  ASSERT_TRUE(BN_set_word(denominator.get(), 1));
  ASSERT_TRUE(
      BN_div(a.get(), b.get(), numerator.get(), denominator.get(), ctx()));
  EXPECT_TRUE(BN_is_zero(b.get()));
  EXPECT_FALSE(BN_is_negative(b.get()));

  // Test that BN_set_negative will not produce a negative zero.
  BN_zero(a.get());
  BN_set_negative(a.get(), 1);
  EXPECT_FALSE(BN_is_negative(a.get()));

  // Test that forcibly creating a negative zero does not break |BN_bn2hex| or
  // |BN_bn2dec|.
  a->neg = 1;
  bssl::UniquePtr<char> dec(BN_bn2dec(a.get()));
  bssl::UniquePtr<char> hex(BN_bn2hex(a.get()));
  ASSERT_TRUE(dec);
  ASSERT_TRUE(hex);
  EXPECT_STREQ("-0", dec.get());
  EXPECT_STREQ("-0", hex.get());

  // Test that |BN_rshift| and |BN_rshift1| will not produce a negative zero.
  ASSERT_TRUE(BN_set_word(a.get(), 1));
  BN_set_negative(a.get(), 1);

  ASSERT_TRUE(BN_rshift(b.get(), a.get(), 1));
  EXPECT_TRUE(BN_is_zero(b.get()));
  EXPECT_FALSE(BN_is_negative(b.get()));

  ASSERT_TRUE(BN_rshift1(c.get(), a.get()));
  EXPECT_TRUE(BN_is_zero(c.get()));
  EXPECT_FALSE(BN_is_negative(c.get()));

  // Test that |BN_div_word| will not produce a negative zero.
  ASSERT_NE((BN_ULONG)-1, BN_div_word(a.get(), 2));
  EXPECT_TRUE(BN_is_zero(a.get()));
  EXPECT_FALSE(BN_is_negative(a.get()));
}